

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O1

p_node_n * __thiscall
dna_bwt_n<dna_string_n>::LF
          (p_node_n *__return_storage_ptr__,dna_bwt_n<dna_string_n> *this,sa_node_n N)

{
  dna_string_n *this_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  uint64_t uVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  uint64_t uVar31;
  p_rank_n local_58;
  
  this_00 = &this->BWT;
  dna_string_n::parallel_rank(&local_58,this_00,N.first_TERM);
  uVar25 = local_58.T;
  uVar19 = local_58.N;
  uVar13 = local_58.G;
  uVar7 = local_58.C;
  uVar2 = local_58.A;
  if (N.first_A != N.first_TERM) {
    dna_string_n::parallel_rank(&local_58,this_00,N.first_A);
  }
  uVar26 = local_58.T;
  uVar20 = local_58.N;
  uVar14 = local_58.G;
  uVar8 = local_58.C;
  uVar31 = local_58.A;
  if (N.first_C != N.first_A) {
    dna_string_n::parallel_rank(&local_58,this_00,N.first_C);
  }
  uVar27 = local_58.T;
  uVar21 = local_58.N;
  uVar15 = local_58.G;
  uVar9 = local_58.C;
  uVar3 = local_58.A;
  if (N.first_G != N.first_C) {
    dna_string_n::parallel_rank(&local_58,this_00,N.first_G);
  }
  uVar28 = local_58.T;
  uVar22 = local_58.N;
  uVar16 = local_58.G;
  uVar10 = local_58.C;
  uVar4 = local_58.A;
  if (N.first_N != N.first_G) {
    dna_string_n::parallel_rank(&local_58,this_00,N.first_N);
  }
  uVar29 = local_58.T;
  uVar23 = local_58.N;
  uVar17 = local_58.G;
  uVar11 = local_58.C;
  uVar5 = local_58.A;
  if (N.first_T != N.first_N) {
    dna_string_n::parallel_rank(&local_58,this_00,N.first_T);
  }
  uVar30 = local_58.T;
  uVar24 = local_58.N;
  uVar18 = local_58.G;
  uVar12 = local_58.C;
  uVar6 = local_58.A;
  if (N.last != N.first_T) {
    dna_string_n::parallel_rank(&local_58,this_00,N.last);
  }
  uVar1 = this->F_A;
  (__return_storage_ptr__->A).first_TERM = uVar2 + uVar1;
  (__return_storage_ptr__->A).first_A = uVar31 + uVar1;
  (__return_storage_ptr__->A).first_C = uVar3 + uVar1;
  (__return_storage_ptr__->A).first_G = uVar4 + uVar1;
  (__return_storage_ptr__->A).first_N = uVar5 + uVar1;
  (__return_storage_ptr__->A).first_T = uVar6 + uVar1;
  (__return_storage_ptr__->A).last = local_58.A + uVar1;
  uVar31 = N.depth + 1;
  (__return_storage_ptr__->A).depth = uVar31;
  uVar2 = this->F_C;
  (__return_storage_ptr__->C).first_TERM = uVar7 + uVar2;
  (__return_storage_ptr__->C).first_A = uVar8 + uVar2;
  (__return_storage_ptr__->C).first_C = uVar9 + uVar2;
  (__return_storage_ptr__->C).first_G = uVar10 + uVar2;
  (__return_storage_ptr__->C).first_N = uVar11 + uVar2;
  (__return_storage_ptr__->C).first_T = uVar12 + uVar2;
  (__return_storage_ptr__->C).last = local_58.C + uVar2;
  (__return_storage_ptr__->C).depth = uVar31;
  uVar2 = this->F_G;
  (__return_storage_ptr__->G).first_TERM = uVar13 + uVar2;
  (__return_storage_ptr__->G).first_A = uVar14 + uVar2;
  (__return_storage_ptr__->G).first_C = uVar15 + uVar2;
  (__return_storage_ptr__->G).first_G = uVar16 + uVar2;
  (__return_storage_ptr__->G).first_N = uVar17 + uVar2;
  (__return_storage_ptr__->G).first_T = uVar18 + uVar2;
  (__return_storage_ptr__->G).last = local_58.G + uVar2;
  (__return_storage_ptr__->G).depth = uVar31;
  uVar2 = this->F_N;
  (__return_storage_ptr__->N).first_TERM = uVar19 + uVar2;
  (__return_storage_ptr__->N).first_A = uVar20 + uVar2;
  (__return_storage_ptr__->N).first_C = uVar21 + uVar2;
  (__return_storage_ptr__->N).first_G = uVar22 + uVar2;
  (__return_storage_ptr__->N).first_N = uVar23 + uVar2;
  (__return_storage_ptr__->N).first_T = uVar24 + uVar2;
  (__return_storage_ptr__->N).last = local_58.N + uVar2;
  (__return_storage_ptr__->N).depth = uVar31;
  uVar2 = this->F_T;
  (__return_storage_ptr__->T).first_TERM = uVar25 + uVar2;
  (__return_storage_ptr__->T).first_A = uVar26 + uVar2;
  (__return_storage_ptr__->T).first_C = uVar27 + uVar2;
  (__return_storage_ptr__->T).first_G = uVar28 + uVar2;
  (__return_storage_ptr__->T).first_N = uVar29 + uVar2;
  (__return_storage_ptr__->T).first_T = uVar30 + uVar2;
  (__return_storage_ptr__->T).last = local_58.T + uVar2;
  (__return_storage_ptr__->T).depth = uVar31;
  return __return_storage_ptr__;
}

Assistant:

p_node_n LF(sa_node_n N){

		p_rank_n before_TERM;
		p_rank_n before_A;
		p_rank_n before_C;
		p_rank_n before_G;
		p_rank_n before_N;
		p_rank_n before_T;
		p_rank_n before_end;

		before_TERM = parallel_rank(N.first_TERM);

		if(N.first_A == N.first_TERM) before_A = before_TERM;
		else before_A = parallel_rank(N.first_A);

		if(N.first_C == N.first_A) before_C = before_A;
		else before_C = parallel_rank(N.first_C);

		if(N.first_G == N.first_C) before_G = before_C;
		else before_G = parallel_rank(N.first_G);

		if(N.first_N == N.first_G) before_N = before_G;
		else before_N = parallel_rank(N.first_N);

		if(N.first_T == N.first_N) before_T = before_N;
		else before_T = parallel_rank(N.first_T);

		if(N.last == N.first_T) before_end = before_T;
		else before_end = parallel_rank(N.last);



		return {
			{F_A + before_TERM.A, F_A + before_A.A, F_A + before_C.A, F_A + before_G.A, F_A + before_N.A, F_A + before_T.A, F_A + before_end.A, N.depth+1},
			{F_C + before_TERM.C, F_C + before_A.C, F_C + before_C.C, F_C + before_G.C, F_C + before_N.C, F_C + before_T.C, F_C + before_end.C, N.depth+1},
			{F_G + before_TERM.G, F_G + before_A.G, F_G + before_C.G, F_G + before_G.G, F_G + before_N.G, F_G + before_T.G, F_G + before_end.G, N.depth+1},
			{F_N + before_TERM.N, F_N + before_A.N, F_N + before_C.N, F_N + before_G.N, F_N + before_N.N, F_N + before_T.N, F_N + before_end.N, N.depth+1},
			{F_T + before_TERM.T, F_T + before_A.T, F_T + before_C.T, F_T + before_G.T, F_T + before_N.T, F_T + before_T.T, F_T + before_end.T, N.depth+1}
		};

	}